

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_mp3_init_internal
                    (ma_dr_mp3 *pMP3,ma_dr_mp3_read_proc onRead,ma_dr_mp3_seek_proc onSeek,
                    void *pUserData,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_uint32 mVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  ma_bool32 mVar5;
  void *pvVar6;
  
  (pMP3->decoder).header[0] = '\0';
  pMP3->onRead = onRead;
  pMP3->onSeek = onSeek;
  pMP3->pUserData = pUserData;
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    pcVar2 = ma_dr_mp3__malloc_default;
    pcVar3 = ma_dr_mp3__realloc_default;
    pcVar4 = ma_dr_mp3__free_default;
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = pAllocationCallbacks->pUserData;
    pcVar2 = pAllocationCallbacks->onMalloc;
    pcVar3 = pAllocationCallbacks->onRealloc;
    pcVar4 = pAllocationCallbacks->onFree;
  }
  (pMP3->allocationCallbacks).pUserData = pvVar6;
  (pMP3->allocationCallbacks).onMalloc = pcVar2;
  (pMP3->allocationCallbacks).onRealloc = pcVar3;
  (pMP3->allocationCallbacks).onFree = pcVar4;
  mVar5 = 0;
  if ((pcVar4 != (_func_void_void_ptr_void_ptr *)0x0) &&
     (pcVar2 != (_func_void_ptr_size_t_void_ptr *)0x0 ||
      pcVar3 != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
    mVar1 = ma_dr_mp3_decode_next_frame(pMP3);
    if (mVar1 == 0) {
      ma_dr_mp3__free_from_callbacks(pMP3->pData,&pMP3->allocationCallbacks);
      mVar5 = 0;
    }
    else {
      pMP3->channels = pMP3->mp3FrameChannels;
      pMP3->sampleRate = pMP3->mp3FrameSampleRate;
      mVar5 = 1;
    }
  }
  return mVar5;
}

Assistant:

static ma_bool32 ma_dr_mp3_init_internal(ma_dr_mp3* pMP3, ma_dr_mp3_read_proc onRead, ma_dr_mp3_seek_proc onSeek, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    MA_DR_MP3_ASSERT(onRead != NULL);
    ma_dr_mp3dec_init(&pMP3->decoder);
    pMP3->onRead = onRead;
    pMP3->onSeek = onSeek;
    pMP3->pUserData = pUserData;
    pMP3->allocationCallbacks = ma_dr_mp3_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);
    if (pMP3->allocationCallbacks.onFree == NULL || (pMP3->allocationCallbacks.onMalloc == NULL && pMP3->allocationCallbacks.onRealloc == NULL)) {
        return MA_FALSE;
    }
    if (ma_dr_mp3_decode_next_frame(pMP3) == 0) {
        ma_dr_mp3__free_from_callbacks(pMP3->pData, &pMP3->allocationCallbacks);
        return MA_FALSE;
    }
    pMP3->channels   = pMP3->mp3FrameChannels;
    pMP3->sampleRate = pMP3->mp3FrameSampleRate;
    return MA_TRUE;
}